

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O0

void __thiscall EOServer::~EOServer(EOServer *this)

{
  World *this_00;
  bool bVar1;
  list<Client_*,_std::allocator<Client_*>_> *this_01;
  reference ppCVar2;
  size_type sVar3;
  vector<Client_*,_std::allocator<Client_*>_> *this_02;
  reference ppCVar4;
  EOClient *eoclient;
  Client *client_1;
  iterator __end3;
  iterator __begin3;
  vector<Client_*,_std::allocator<Client_*>_> *__range3;
  vector<Client_*,_std::allocator<Client_*>_> *active_clients;
  Client *client;
  iterator __end1;
  iterator __begin1;
  list<Client_*,_std::allocator<Client_*>_> *__range1;
  EOServer *this_local;
  
  (this->super_Server)._vptr_Server = (_func_int **)&PTR_ClientFactory_003b0900;
  this_01 = &(this->super_Server).clients;
  __end1 = std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::begin(this_01);
  client = (Client *)std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::end(this_01);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&client), bVar1) {
    ppCVar2 = std::_List_iterator<Client_*>::operator*(&__end1);
    Client::Close(*ppCVar2,false);
    std::_List_iterator<Client_*>::operator++(&__end1);
  }
  while (sVar3 = std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::size
                           (&(this->super_Server).clients), sVar3 != 0) {
    this_02 = Server::Select(&this->super_Server,0.1);
    if (this_02 != (vector<Client_*,_std::allocator<Client_*>_> *)0x0) {
      __end3 = std::vector<Client_*,_std::allocator<Client_*>_>::begin(this_02);
      client_1 = (Client *)std::vector<Client_*,_std::allocator<Client_*>_>::end(this_02);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Client_**,_std::vector<Client_*,_std::allocator<Client_*>_>_>
                                         *)&client_1), bVar1) {
        ppCVar4 = __gnu_cxx::
                  __normal_iterator<Client_**,_std::vector<Client_*,_std::allocator<Client_*>_>_>::
                  operator*(&__end3);
        EOClient::Tick((EOClient *)*ppCVar4);
        __gnu_cxx::__normal_iterator<Client_**,_std::vector<Client_*,_std::allocator<Client_*>_>_>::
        operator++(&__end3);
      }
      std::vector<Client_*,_std::allocator<Client_*>_>::clear(this_02);
    }
    Server::BuryTheDead(&this->super_Server);
  }
  if (this->sln != (SLN *)0x0) {
    operator_delete(this->sln,8);
  }
  this_00 = this->world;
  if (this_00 != (World *)0x0) {
    World::~World(this_00);
    operator_delete(this_00,0x948);
  }
  std::
  unordered_map<IPAddress,_double,_std::hash<IPAddress>,_std::equal_to<IPAddress>,_std::allocator<std::pair<const_IPAddress,_double>_>_>
  ::~unordered_map(&this->connection_log);
  Server::~Server(&this->super_Server);
  return;
}

Assistant:

EOServer::~EOServer()
{
	// All clients must be fully closed before the world ends
	UTIL_FOREACH(this->clients, client)
	{
		client->Close();
	}

	// Spend up to 2 seconds shutting down
	while (this->clients.size() > 0)
	{
		std::vector<Client *> *active_clients = this->Select(0.1);

		if (active_clients)
		{
			UTIL_FOREACH(*active_clients, client)
			{
				EOClient *eoclient = static_cast<EOClient *>(client);
				eoclient->Tick();
			}

			active_clients->clear();
		}

		this->BuryTheDead();
	}

	delete this->sln;
	delete this->world;
}